

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

int64_t spvtools::opt::anon_unknown_15::CalculateGCDFromCoefficients
                  (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   *recurrences,int64_t running_gcd)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  SENode *pSVar4;
  undefined4 extraout_var;
  int64_t iVar5;
  undefined4 extraout_var_00;
  SEConstantNode *coefficient;
  SERecurrentNode *recurrence;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *__range2;
  int64_t running_gcd_local;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *recurrences_local;
  
  __end2 = std::
           vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           ::begin(recurrences);
  recurrence = (SERecurrentNode *)
               std::
               vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               ::end(recurrences);
  __range2 = (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)running_gcd;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                                *)&recurrence);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
              ::operator*(&__end2);
    pSVar4 = SERecurrentNode::GetCoefficient(*ppSVar3);
    iVar2 = (*pSVar4->_vptr_SENode[4])();
    iVar5 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var,iVar2));
    iVar2 = std::abs((int)iVar5);
    __range2 = (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)GreatestCommonDivisor((int64_t)__range2,CONCAT44(extraout_var_00,iVar2));
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
    ::operator++(&__end2);
  }
  return (int64_t)__range2;
}

Assistant:

int64_t CalculateGCDFromCoefficients(
    const std::vector<SERecurrentNode*>& recurrences, int64_t running_gcd) {
  for (SERecurrentNode* recurrence : recurrences) {
    auto coefficient = recurrence->GetCoefficient()->AsSEConstantNode();

    running_gcd = GreatestCommonDivisor(
        running_gcd, std::abs(coefficient->FoldToSingleValue()));
  }

  return running_gcd;
}